

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfArgFormatter<char>::visit_cstring(PrintfArgFormatter<char> *this,char *value)

{
  FormatSpec *pFVar1;
  size_t in_RCX;
  void *__buf;
  char *value_local;
  PrintfArgFormatter<char> *this_local;
  
  if (value == (char *)0x0) {
    pFVar1 = BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>::spec
                       (&this->
                         super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>);
    if (pFVar1->type_ == 'p') {
      write_null_pointer(this);
    }
    else {
      BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>::write
                (&this->super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>,
                 0x3d5937,__buf,in_RCX);
    }
  }
  else {
    BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>::visit_cstring
              (&this->super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>,value);
  }
  return;
}

Assistant:

void visit_cstring(const char *value) {
    if (value)
      Base::visit_cstring(value);
    else if (this->spec().type_ == 'p')
      write_null_pointer();
    else
      this->write("(null)");
  }